

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsConvertValueToObject(JsValueRef value,JsValueRef *result)

{
  anon_class_16_2_1884b1c3 fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *result_local;
  JsValueRef value_local;
  
  fn.result = &local_18;
  fn.value = &result_local;
  local_18 = result;
  result_local = (JsValueRef *)value;
  JVar1 = ContextAPIWrapper<false,JsConvertValueToObject::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsConvertValueToObject(_In_ JsValueRef value, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToObjectConversion, (Js::Var)value);

        VALIDATE_INCOMING_REFERENCE(value, scriptContext);
        PARAM_NOT_NULL(result);

        *result = (JsValueRef)Js::JavascriptOperators::ToObject((Js::Var)value, scriptContext);
        Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}